

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

void __thiscall polyscope::SlicePlane::~SlicePlane(SlicePlane *this)

{
  Engine *this_00;
  __normal_iterator<polyscope::SlicePlane_**,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
  __position;
  string local_38;
  
  this_00 = render::engine;
  std::__cxx11::string::string((string *)&local_38,(string *)&this->postfix);
  render::Engine::removeSlicePlane(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<polyscope::SlicePlane**,std::vector<polyscope::SlicePlane*,std::allocator<polyscope::SlicePlane*>>>,__gnu_cxx::__ops::_Iter_equals_val<polyscope::SlicePlane*const>>
                         (state::slicePlanes,DAT_00480e78);
  if (__position._M_current != DAT_00480e78) {
    std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>::erase
              ((vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_> *)
               &state::slicePlanes,(const_iterator)__position._M_current);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->planeProgram).
              super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  TransformationGizmo::~TransformationGizmo(&this->transformGizmo);
  PersistentValue<float>::~PersistentValue(&this->transparency);
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::~PersistentValue(&this->color);
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::~PersistentValue
            (&this->objectTransform);
  PersistentValue<bool>::~PersistentValue(&this->drawPlane);
  PersistentValue<bool>::~PersistentValue(&this->active);
  std::__cxx11::string::~string((string *)&this->postfix);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

SlicePlane::~SlicePlane() {
  render::engine->removeSlicePlane(postfix);
  auto pos = std::find(state::slicePlanes.begin(), state::slicePlanes.end(), this);
  if (pos == state::slicePlanes.end()) return;
  state::slicePlanes.erase(pos);
}